

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O3

int llmsset_mark(llmsset_t dbs,uint64_t index)

{
  ulong *puVar1;
  uint64_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  puVar2 = dbs->bitmap2;
  uVar4 = 0x8000000000000000 >> (index & 0x3f);
  do {
    uVar3 = puVar2[index >> 6];
    if ((uVar3 & uVar4) != 0) {
      return 0;
    }
    puVar1 = puVar2 + (index >> 6);
    LOCK();
    bVar5 = uVar3 == *puVar1;
    if (bVar5) {
      *puVar1 = uVar3 | uVar4;
    }
    UNLOCK();
  } while (!bVar5);
  return 1;
}

Assistant:

int
llmsset_mark(const llmsset_t dbs, uint64_t index)
{
    _Atomic(uint64_t)* ptr = dbs->bitmap2 + (index/64);
    uint64_t mask = 0x8000000000000000LL >> (index&63);
    for (;;) {
        uint64_t v = *ptr;
        if (v & mask) return 0;
        if (atomic_compare_exchange_weak(ptr, &v, v|mask)) return 1;
    }
}